

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O2

void testTinySVD_3x3<float>(Matrix33<float> *A)

{
  bool bVar1;
  ostream *poVar2;
  float (*pafVar3) [3];
  int i;
  long lVar4;
  int j;
  long lVar5;
  int cols [3];
  Matrix33<float> B;
  int local_58 [3];
  float local_4c;
  float afStack_48 [8];
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Verifying SVD for [[");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,A->x[0][0]);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,A->x[0][1]);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,A->x[0][2]);
  poVar2 = std::operator<<(poVar2,"], ");
  poVar2 = std::operator<<(poVar2,"[");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,A->x[1][0]);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,A->x[1][1]);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,A->x[1][2]);
  poVar2 = std::operator<<(poVar2,"], ");
  poVar2 = std::operator<<(poVar2,"[");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,A->x[2][0]);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,A->x[2][1]);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,A->x[2][2]);
  std::operator<<(poVar2,"]]\n");
  verifyTinySVD_3x3<float>(A);
  Imath_2_5::Matrix33<float>::transposed(A);
  verifyTinySVD_3x3<float>((Matrix33<float> *)&local_4c);
  local_58[0] = 0;
  local_58[1] = 1;
  local_58[2] = 2;
  do {
    afStack_48[4] = 0.0;
    afStack_48[5] = 0.0;
    afStack_48[6] = 0.0;
    afStack_48[0] = 0.0;
    afStack_48[1] = 0.0;
    afStack_48[2] = 0.0;
    local_4c = 1.0;
    afStack_48[3] = 1.0;
    afStack_48[7] = 1.0;
    pafVar3 = (float (*) [3])&local_4c;
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
        (*(float (*) [3])*pafVar3)[lVar5] = A->x[lVar4][local_58[lVar5]];
      }
      pafVar3 = pafVar3 + 1;
    }
    verifyTinySVD_3x3<float>((Matrix33<float> *)&local_4c);
    bVar1 = std::__next_permutation<int*,__gnu_cxx::__ops::_Iter_less_iter>(local_58);
  } while (bVar1);
  return;
}

Assistant:

void
testTinySVD_3x3 (const IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A)
{
    std::cout << "Verifying SVD for [[" << A[0][0] << ", " << A[0][1] << ", " << A[0][2] << "], "
                                 << "[" << A[1][0] << ", " << A[1][1] << ", " << A[1][2] << "], "
                                 << "[" << A[2][0] << ", " << A[2][1] << ", " << A[2][2] << "]]\n";
 
    verifyTinySVD_3x3 (A);
    verifyTinySVD_3x3 (A.transposed());

    // Try all different orderings of the columns of A:
    int cols[3] = { 0, 1, 2 };
    do
    {
        IMATH_INTERNAL_NAMESPACE::Matrix33<T> B;
        for (int i = 0; i < 3; ++i)
            for (int j = 0; j < 3; ++j)
                B[i][j] = A[i][cols[j]];

        verifyTinySVD_3x3 (B);
    } while (std::next_permutation (cols, cols + 3));
}